

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall punky::par::Parser::Parser(Parser *this,Lexer *lex)

{
  _Any_data local_260;
  code *local_250;
  code *local_248;
  _Any_data local_240;
  code *local_230;
  code *local_228;
  _Any_data local_220;
  code *local_210;
  code *local_208;
  _Any_data local_200;
  code *local_1f0;
  code *local_1e8;
  _Any_data local_1e0;
  code *local_1d0;
  code *local_1c8;
  _Any_data local_1c0;
  code *local_1b0;
  code *local_1a8;
  _Any_data local_1a0;
  code *local_190;
  code *local_188;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  _Any_data local_160;
  code *local_150;
  code *local_148;
  _Any_data local_140;
  code *local_130;
  code *local_128;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  _Any_data local_e0;
  code *local_d0;
  code *local_c8;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  punky::lex::Lexer::Lexer(&this->m_lex,lex);
  (this->m_curr_tok).m_type = LeftParen;
  (this->m_curr_tok).m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->m_peek_tok).m_type = LeftParen;
  (this->m_peek_tok).m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_prefix_parse_fns)._M_h._M_buckets = &(this->m_prefix_parse_fns)._M_h._M_single_bucket;
  (this->m_prefix_parse_fns)._M_h._M_bucket_count = 1;
  (this->m_prefix_parse_fns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prefix_parse_fns)._M_h._M_element_count = 0;
  (this->m_prefix_parse_fns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prefix_parse_fns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prefix_parse_fns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_infix_parse_fns)._M_h._M_buckets = &(this->m_infix_parse_fns)._M_h._M_single_bucket;
  (this->m_infix_parse_fns)._M_h._M_bucket_count = 1;
  (this->m_infix_parse_fns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_infix_parse_fns)._M_h._M_element_count = 0;
  (this->m_infix_parse_fns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_infix_parse_fns)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_infix_parse_fns)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  consume(this);
  consume(this);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:27:44)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:27:44)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  register_prefix(this,Identifier,(PrefixParseFn *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_60._8_8_ = 0;
  local_48 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:28:37)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:28:37)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  register_prefix(this,Int,(PrefixParseFn *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:29:38)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:29:38)>
             ::_M_manager;
  local_80._M_unused._M_object = this;
  register_prefix(this,Bang,(PrefixParseFn *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  local_a0._8_8_ = 0;
  local_88 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:30:39)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:30:39)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  register_prefix(this,Minus,(PrefixParseFn *)&local_a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a0);
  local_c0._8_8_ = 0;
  local_a8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:31:38)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:31:38)>
             ::_M_manager;
  local_c0._M_unused._M_object = this;
  register_prefix(this,True,(PrefixParseFn *)&local_c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_c0);
  local_e0._8_8_ = 0;
  local_c8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:32:39)>
             ::_M_invoke;
  local_d0 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:32:39)>
             ::_M_manager;
  local_e0._M_unused._M_object = this;
  register_prefix(this,False,(PrefixParseFn *)&local_e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_e0);
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:33:43)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:33:43)>
             ::_M_manager;
  local_100._M_unused._M_object = this;
  register_prefix(this,LeftParen,(PrefixParseFn *)&local_100);
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  local_120._8_8_ = 0;
  local_108 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:34:36)>
              ::_M_invoke;
  local_110 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:34:36)>
              ::_M_manager;
  local_120._M_unused._M_object = this;
  register_prefix(this,If,(PrefixParseFn *)&local_120);
  std::_Function_base::~_Function_base((_Function_base *)&local_120);
  local_140._8_8_ = 0;
  local_128 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:35:38)>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:35:38)>
              ::_M_manager;
  local_140._M_unused._M_object = this;
  register_prefix(this,Func,(PrefixParseFn *)&local_140);
  std::_Function_base::~_Function_base((_Function_base *)&local_140);
  local_160._8_8_ = 0;
  local_148 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:37:37)>
              ::_M_invoke;
  local_150 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:37:37)>
              ::_M_manager;
  local_160._M_unused._M_object = this;
  register_infix(this,Plus,(InfixParseFn *)&local_160);
  std::_Function_base::~_Function_base((_Function_base *)&local_160);
  local_180._8_8_ = 0;
  local_168 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:40:38)>
              ::_M_invoke;
  local_170 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:40:38)>
              ::_M_manager;
  local_180._M_unused._M_object = this;
  register_infix(this,Minus,(InfixParseFn *)&local_180);
  std::_Function_base::~_Function_base((_Function_base *)&local_180);
  local_1a0._8_8_ = 0;
  local_188 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:43:41)>
              ::_M_invoke;
  local_190 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:43:41)>
              ::_M_manager;
  local_1a0._M_unused._M_object = this;
  register_infix(this,Asterisk,(InfixParseFn *)&local_1a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a0);
  local_1c0._8_8_ = 0;
  local_1a8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:46:38)>
              ::_M_invoke;
  local_1b0 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:46:38)>
              ::_M_manager;
  local_1c0._M_unused._M_object = this;
  register_infix(this,Slash,(InfixParseFn *)&local_1c0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c0);
  local_1e0._8_8_ = 0;
  local_1c8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:49:43)>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:49:43)>
              ::_M_manager;
  local_1e0._M_unused._M_object = this;
  register_infix(this,EqualEqual,(InfixParseFn *)&local_1e0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e0);
  local_200._8_8_ = 0;
  local_1e8 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:52:42)>
              ::_M_invoke;
  local_1f0 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:52:42)>
              ::_M_manager;
  local_200._M_unused._M_object = this;
  register_infix(this,BangEqual,(InfixParseFn *)&local_200);
  std::_Function_base::~_Function_base((_Function_base *)&local_200);
  local_220._8_8_ = 0;
  local_208 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:55:37)>
              ::_M_invoke;
  local_210 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:55:37)>
              ::_M_manager;
  local_220._M_unused._M_object = this;
  register_infix(this,Less,(InfixParseFn *)&local_220);
  std::_Function_base::~_Function_base((_Function_base *)&local_220);
  local_240._8_8_ = 0;
  local_228 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:58:40)>
              ::_M_invoke;
  local_230 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:58:40)>
              ::_M_manager;
  local_240._M_unused._M_object = this;
  register_infix(this,Greater,(InfixParseFn *)&local_240);
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  local_260._8_8_ = 0;
  local_248 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:61:42)>
              ::_M_invoke;
  local_250 = std::
              _Function_handler<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_(std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/buzzcut-s[P]punky/src/Parser.cpp:61:42)>
              ::_M_manager;
  local_260._M_unused._M_object = this;
  register_infix(this,LeftParen,(InfixParseFn *)&local_260);
  std::_Function_base::~_Function_base((_Function_base *)&local_260);
  return;
}

Assistant:

Parser::Parser(Lexer lex) :
  m_lex{std::move(lex)}
{
    consume();
    consume();

    register_prefix(TokenType::Identifier, [this] { return parse_identifier(); });
    register_prefix(TokenType::Int, [this] { return parse_int_literal(); });
    register_prefix(TokenType::Bang, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::Minus, [this] { return parse_prefix_expression(); });
    register_prefix(TokenType::True, [this] { return parse_boolean(); });
    register_prefix(TokenType::False, [this] { return parse_boolean(); });
    register_prefix(TokenType::LeftParen, [this] { return parse_grouped_expression(); });
    register_prefix(TokenType::If, [this] { return parse_if_expression(); });
    register_prefix(TokenType::Func, [this] { return parse_function_literal(); });

    register_infix(TokenType::Plus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Minus, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Asterisk, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Slash, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::EqualEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::BangEqual, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Less, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::Greater, [this](ast::ExprNodePtr left_expr) {
        return parse_infix_expression(std::move(left_expr));
    });
    register_infix(TokenType::LeftParen, [this](ast::ExprNodePtr function) {
        return parse_call_expression(std::move(function));
    });
}